

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O2

_List_iterator<signed_char>
burst::detail::
galloping_search<std::_List_iterator<signed_char>,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
          (_List_iterator<signed_char> first,_List_iterator<signed_char> last,int *value)

{
  bool bVar1;
  ptrdiff_t pVar2;
  _List_iterator<signed_char> _Var3;
  long __n;
  long lVar4;
  anon_class_16_2_ce2e793d __pred;
  not_fn_t<burst::invert_t<std::less<void>_>_> local_39;
  _List_node_base *local_38;
  
  __pred.compare = &local_39;
  __pred.value = value;
  bVar1 = std::
          is_partitioned<std::_List_iterator<signed_char>,burst::detail::galloping_search<std::_List_iterator<signed_char>,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>(std::_List_iterator<signed_char>,std::_List_iterator<signed_char>,int_const&,burst::not_fn_t<burst::invert_t<std::less<void>>>)::_lambda(auto:1_const&)_1_>
                    (first,last,__pred);
  if (bVar1) {
    local_38 = last._M_node;
    pVar2 = std::__distance<signed_char>(first._M_node,last._M_node);
    __n = 1;
    lVar4 = 0;
    while ((_Var3._M_node = local_38, lVar4 + __n < pVar2 &&
           (_Var3 = std::next<std::_List_iterator<signed_char>>(first,__n),
           (int)*(char *)&_Var3._M_node[1]._M_next <= *value))) {
      first = std::next<std::_List_iterator<signed_char>>(_Var3,1);
      lVar4 = lVar4 + __n + 1;
      __n = __n * 2;
    }
    _Var3 = std::
            __lower_bound<std::_List_iterator<signed_char>,int,__gnu_cxx::__ops::_Iter_comp_val<burst::not_fn_t<burst::invert_t<std::less<void>>>>>
                      (first._M_node,_Var3._M_node,value);
    return (_List_iterator<signed_char>)_Var3._M_node;
  }
  __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                ,0x16,
                "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = std::_List_iterator<signed char>, Value = int, Compare = burst::not_fn_t<burst::invert_t<std::less<void>>>]"
               );
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }